

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_2misc_narrow(DisasContext_conflict1 *s,_Bool scalar,int opcode,_Bool u,_Bool is_q,
                        int size,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  int iVar2;
  TCGv_i64 tcg_dest;
  TCGv_i32 pTVar3;
  TCGv_i32 hi;
  TCGv_ptr arg2;
  TCGv_i32 arg3;
  TCGv_i32 ahp;
  TCGv_ptr fpst;
  TCGv_i32 tcg_hi;
  TCGv_i32 tcg_lo;
  NeonGenNarrowEnvFn *genenvfn;
  NeonGenNarrowFn *genfn;
  TCGv_i64 tcg_op;
  int passes;
  int destelt;
  TCGv_i32 tcg_res [2];
  int local_2c;
  int pass;
  TCGContext_conflict1 *tcg_ctx;
  int size_local;
  _Bool is_q_local;
  _Bool u_local;
  int opcode_local;
  _Bool scalar_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = 0;
  if (is_q) {
    iVar1 = 2;
  }
  iVar2 = 2;
  if (scalar) {
    iVar2 = 1;
    tcg_res[0] = tcg_const_i32_aarch64(tcg_ctx_00,0);
  }
  local_2c = 0;
  do {
    if (iVar2 <= local_2c) {
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        write_vec_element_i32
                  (s,*(TCGv_i32 *)(&passes + (long)local_2c * 2),rd,iVar1 + local_2c,MO_32);
        tcg_temp_free_i32(tcg_ctx_00,*(TCGv_i32 *)(&passes + (long)local_2c * 2));
      }
      clear_vec_high(s,is_q,rd);
      return;
    }
    tcg_dest = tcg_temp_new_i64(tcg_ctx_00);
    genenvfn = (NeonGenNarrowEnvFn *)0x0;
    tcg_lo = (TCGv_i32)0x0;
    if (scalar) {
      read_vec_element(s,tcg_dest,rn,local_2c,size + MO_16);
    }
    else {
      read_vec_element(s,tcg_dest,rn,local_2c,MO_64);
    }
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    *(TCGv_i32 *)(&passes + (long)local_2c * 2) = pTVar3;
    if (opcode == 0x12) {
      if (u) {
        tcg_lo = (TCGv_i32)handle_2misc_narrow::sqxtunfns[size];
      }
      else {
        genenvfn = (NeonGenNarrowEnvFn *)handle_2misc_narrow::xtnfns[size];
      }
    }
    else if (opcode == 0x14) {
      tcg_lo = (TCGv_i32)handle_2misc_narrow::fns[size][u];
    }
    else if (opcode == 0x16) {
      if (size == 2) {
        gen_helper_vfp_fcvtsd
                  (tcg_ctx_00,*(TCGv_i32 *)(&passes + (long)local_2c * 2),tcg_dest,
                   tcg_ctx_00->cpu_env);
      }
      else {
        pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
        hi = tcg_temp_new_i32(tcg_ctx_00);
        arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
        arg3 = get_ahp_flag(tcg_ctx_00);
        tcg_gen_extr_i64_i32_aarch64(tcg_ctx_00,pTVar3,hi,tcg_dest);
        gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx_00,pTVar3,pTVar3,arg2,arg3);
        gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx_00,hi,hi,arg2,arg3);
        tcg_gen_deposit_i32_aarch64
                  (tcg_ctx_00,*(TCGv_i32 *)(&passes + (long)local_2c * 2),pTVar3,hi,0x10,0x10);
        tcg_temp_free_i32(tcg_ctx_00,pTVar3);
        tcg_temp_free_i32(tcg_ctx_00,hi);
        tcg_temp_free_ptr(tcg_ctx_00,arg2);
        tcg_temp_free_i32(tcg_ctx_00,arg3);
      }
    }
    else {
      if (opcode != 0x56) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x276e,(char *)0x0);
      }
      if (size != 2) {
        __assert_fail("size == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                      ,0x276a,
                      "void handle_2misc_narrow(DisasContext *, _Bool, int, _Bool, _Bool, int, int, int)"
                     );
      }
      gen_helper_fcvtx_f64_to_f32
                (tcg_ctx_00,*(TCGv_i32 *)(&passes + (long)local_2c * 2),tcg_dest,tcg_ctx_00->cpu_env
                );
    }
    if (genenvfn == (NeonGenNarrowEnvFn *)0x0) {
      if (tcg_lo != (TCGv_i32)0x0) {
        (*(code *)tcg_lo)(tcg_ctx_00,*(undefined8 *)(&passes + (long)local_2c * 2),
                          tcg_ctx_00->cpu_env,tcg_dest);
      }
    }
    else {
      (*genenvfn)(tcg_ctx_00,*(TCGv_i32 *)(&passes + (long)local_2c * 2),(TCGv_ptr)tcg_dest,
                  (TCGv_i64)(long)local_2c);
    }
    tcg_temp_free_i64(tcg_ctx_00,tcg_dest);
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static void handle_2misc_narrow(DisasContext *s, bool scalar,
                                int opcode, bool u, bool is_q,
                                int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 2-reg-misc ops which are narrowing (so each 2*size element
     * in the source becomes a size element in the destination).
     */
    int pass;
    TCGv_i32 tcg_res[2];
    int destelt = is_q ? 2 : 0;
    int passes = scalar ? 1 : 2;

    if (scalar) {
        tcg_res[1] = tcg_const_i32(tcg_ctx, 0);
    }

    for (pass = 0; pass < passes; pass++) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        NeonGenNarrowFn *genfn = NULL;
        NeonGenNarrowEnvFn *genenvfn = NULL;

        if (scalar) {
            read_vec_element(s, tcg_op, rn, pass, size + 1);
        } else {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
        }
        tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

        switch (opcode) {
        case 0x12: /* XTN, SQXTUN */
        {
            static NeonGenNarrowFn * const xtnfns[3] = {
                gen_helper_neon_narrow_u8,
                gen_helper_neon_narrow_u16,
                tcg_gen_extrl_i64_i32,
            };
            static NeonGenNarrowEnvFn * const sqxtunfns[3] = {
                gen_helper_neon_unarrow_sat8,
                gen_helper_neon_unarrow_sat16,
                gen_helper_neon_unarrow_sat32,
            };
            if (u) {
                genenvfn = sqxtunfns[size];
            } else {
                genfn = xtnfns[size];
            }
            break;
        }
        case 0x14: /* SQXTN, UQXTN */
        {
            static NeonGenNarrowEnvFn * const fns[3][2] = {
                { gen_helper_neon_narrow_sat_s8,
                  gen_helper_neon_narrow_sat_u8 },
                { gen_helper_neon_narrow_sat_s16,
                  gen_helper_neon_narrow_sat_u16 },
                { gen_helper_neon_narrow_sat_s32,
                  gen_helper_neon_narrow_sat_u32 },
            };
            genenvfn = fns[size][u];
            break;
        }
        case 0x16: /* FCVTN, FCVTN2 */
            /* 32 bit to 16 bit or 64 bit to 32 bit float conversion */
            if (size == 2) {
                gen_helper_vfp_fcvtsd(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            } else {
                TCGv_i32 tcg_lo = tcg_temp_new_i32(tcg_ctx);
                TCGv_i32 tcg_hi = tcg_temp_new_i32(tcg_ctx);
                TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);
                TCGv_i32 ahp = get_ahp_flag(tcg_ctx);

                tcg_gen_extr_i64_i32(tcg_ctx, tcg_lo, tcg_hi, tcg_op);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_lo, tcg_lo, fpst, ahp);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_hi, tcg_hi, fpst, ahp);
                tcg_gen_deposit_i32(tcg_ctx, tcg_res[pass], tcg_lo, tcg_hi, 16, 16);
                tcg_temp_free_i32(tcg_ctx, tcg_lo);
                tcg_temp_free_i32(tcg_ctx, tcg_hi);
                tcg_temp_free_ptr(tcg_ctx, fpst);
                tcg_temp_free_i32(tcg_ctx, ahp);
            }
            break;
        case 0x56:  /* FCVTXN, FCVTXN2 */
            /* 64 bit to 32 bit float conversion
             * with von Neumann rounding (round to odd)
             */
            assert(size == 2);
            gen_helper_fcvtx_f64_to_f32(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            break;
        default:
            g_assert_not_reached();
        }

        if (genfn) {
            genfn(tcg_ctx, tcg_res[pass], tcg_op);
        } else if (genenvfn) {
            genenvfn(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env, tcg_op);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_op);
    }

    for (pass = 0; pass < 2; pass++) {
        write_vec_element_i32(s, tcg_res[pass], rd, destelt + pass, MO_32);
        tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
    }
    clear_vec_high(s, is_q, rd);
}